

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void randomBlob(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  void *pBuf;
  uchar *p;
  int n;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  p._4_4_ = sqlite3_value_int(*argv);
  if (p._4_4_ < 1) {
    p._4_4_ = 1;
  }
  pBuf = contextMalloc(context,(long)p._4_4_);
  if (pBuf != (void *)0x0) {
    sqlite3_randomness(p._4_4_,pBuf);
    sqlite3_result_blob(context,pBuf,p._4_4_,sqlite3_free);
  }
  return;
}

Assistant:

static void randomBlob(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int n;
  unsigned char *p;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int(argv[0]);
  if( n<1 ){
    n = 1;
  }
  p = contextMalloc(context, n);
  if( p ){
    sqlite3_randomness(n, p);
    sqlite3_result_blob(context, (char*)p, n, sqlite3_free);
  }
}